

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Token * __thiscall wabt::WastParser::TokenQueue::at(TokenQueue *this,size_t n)

{
  Token *pTVar1;
  
  if (n < 2) {
    pTVar1 = std::optional<wabt::Token>::value((this->tokens)._M_elems + (this->i ^ n));
    return pTVar1;
  }
  __assert_fail("n <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0xf29,"const Token &wabt::WastParser::TokenQueue::at(size_t) const");
}

Assistant:

const Token& WastParser::TokenQueue::at(size_t n) const {
  assert(n <= 1);
  return tokens[i ^ static_cast<bool>(n)].value();
}